

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.c
# Opt level: O2

void assert_that_double_(char *file,int line,char *expression,double actual,Constraint *constraint)

{
  _func_void_TestReporter_ptr_char_ptr_int_int_char_ptr_varargs *p_Var1;
  _func__Bool_Constraint_ptr_CgreenValue *p_Var2;
  char *pcVar3;
  char *pcVar4;
  CgreenValue CVar5;
  _Bool _Var6;
  int iVar7;
  TestReporter *pTVar8;
  void *__ptr;
  CgreenValue local_48;
  
  if (constraint != (Constraint *)0x0) {
    _Var6 = is_not_comparing(constraint);
    if (_Var6) {
      pTVar8 = get_test_reporter();
      p_Var1 = pTVar8->assert_true;
      pTVar8 = get_test_reporter();
      (*p_Var1)(pTVar8,file,line,0,
                "Got constraint of type [%s],\n\t\tbut they are not allowed for assertions, only in mock expectations."
                ,constraint->name);
      (*constraint->destroy)(constraint);
      return;
    }
  }
  if (constraint->type != CGREEN_DOUBLE_COMPARER_CONSTRAINT) {
    pTVar8 = get_test_reporter();
    p_Var1 = pTVar8->assert_true;
    pTVar8 = get_test_reporter();
    (*p_Var1)(pTVar8,file,line,0,
              "Only constraints of double type should be used with \'assert_that_double()\'.\n\t\tOther types of constraints, such as [%s], will probably fail comparison."
              ,constraint->name);
  }
  __ptr = (void *)box_double(actual);
  pTVar8 = get_test_reporter();
  p_Var1 = pTVar8->assert_true;
  pTVar8 = get_test_reporter();
  p_Var2 = constraint->compare;
  make_cgreen_double_value(&local_48,actual);
  CVar5.value.integer_value = local_48.value.integer_value;
  CVar5.type = local_48.type;
  CVar5._4_4_ = local_48._4_4_;
  CVar5.value_size._0_4_ = (int)local_48.value_size;
  CVar5.value_size._4_4_ = (int)(local_48.value_size >> 0x20);
  _Var6 = (*p_Var2)(constraint,CVar5);
  pcVar3 = constraint->name;
  pcVar4 = constraint->expected_value_name;
  iVar7 = get_significant_figures();
  (*p_Var1)(pTVar8,file,line,(uint)_Var6,
            "Expected [%s] to [%s] [%s] within [%d] significant figures\n\t\tactual value:\t\t\t[%08f]\n\t\texpected value:\t\t\t[%08f]"
            ,SUB84(actual,0),(constraint->expected_value).value.integer_value,expression,pcVar3,
            pcVar4,iVar7);
  free(__ptr);
  (*constraint->destroy)(constraint);
  return;
}

Assistant:

void assert_that_double_(const char *file, int line, const char *expression, double actual, Constraint* constraint) {
    BoxedDouble* boxed_actual;

    if (NULL != constraint && is_not_comparing(constraint)) {
        (*get_test_reporter()->assert_true)(
                get_test_reporter(),
                file,
                line,
                false,
                "Got constraint of type [%s],\n"
                "\t\tbut they are not allowed for assertions, only in mock expectations.",
                constraint->name);

        constraint->destroy(constraint);

        return;
    }

    if (constraint->type != CGREEN_DOUBLE_COMPARER_CONSTRAINT) {
        (*get_test_reporter()->assert_true)(
                get_test_reporter(),
                file,
                line,
                false,
                "Only constraints of double type should be used with 'assert_that_double()'.\n"
                "\t\tOther types of constraints, such as [%s], will probably fail comparison.",
                constraint->name);
    }

    boxed_actual = (BoxedDouble*)box_double(actual);

    (*get_test_reporter()->assert_true)(get_test_reporter(), file, line,
            (*constraint->compare)(constraint, make_cgreen_double_value(actual)),
            "Expected [%s] to [%s] [%s] within [%d] significant figures\n"
            "\t\tactual value:\t\t\t[%08f]\n"
            "\t\texpected value:\t\t\t[%08f]",
            expression,
            constraint->name,
            constraint->expected_value_name,
            get_significant_figures(),
            actual,
            constraint->expected_value.value.double_value);

    free(boxed_actual);
    constraint->destroy(constraint);
}